

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  uint ttf_size;
  uint uVar1;
  uchar *ttf_data;
  ImFont *pIVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  ImFontConfig *pIVar6;
  ushort *puVar7;
  ushort *puVar8;
  uchar *puVar9;
  byte bVar10;
  ImFontConfig local_b0;
  
  bVar10 = 0;
  ttf_size = stb_decompress_length((uchar *)compressed_ttf_data);
  ttf_data = (uchar *)ImGui::MemAlloc((ulong)ttf_size);
  uVar1 = *compressed_ttf_data;
  if (((uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) !=
       0x57bc0000) ||
     (uVar1 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar1 >> 0x18 != 0 || (uVar1 & 0xff0000) != 0) || (uVar1 & 0xff00) != 0) ||
     (uVar1 & 0xff) != 0)) {
LAB_00174f54:
    if (font_cfg_template == (ImFontConfig *)0x0) {
      local_b0.FontData = (void *)0x0;
      local_b0.FontDataSize = 0;
      local_b0.FontNo = 0;
      local_b0.SizePixels = 0.0;
      local_b0.OversampleH = 3;
      local_b0.OversampleV = 1;
      local_b0.PixelSnapH = false;
      local_b0.GlyphRanges = (ImWchar *)0x0;
      local_b0.MergeMode = false;
      local_b0.RasterizerFlags = 0;
      local_b0.RasterizerMultiply = 1.0;
      local_b0.GlyphExtraSpacing.x = 0.0;
      local_b0.GlyphExtraSpacing.y = 0.0;
      local_b0.GlyphOffset.x = 0.0;
      local_b0.GlyphOffset.y = 0.0;
      local_b0.Name[0] = '\0';
      local_b0.Name[1] = '\0';
      local_b0.Name[2] = '\0';
      local_b0.Name[3] = '\0';
      local_b0.Name[4] = '\0';
      local_b0.Name[5] = '\0';
      local_b0.Name[6] = '\0';
      local_b0.Name[7] = '\0';
      local_b0.Name[8] = '\0';
      local_b0.Name[9] = '\0';
      local_b0.Name[10] = '\0';
      local_b0.Name[0xb] = '\0';
      local_b0.Name[0xc] = '\0';
      local_b0.Name[0xd] = '\0';
      local_b0.Name[0xe] = '\0';
      local_b0.Name[0xf] = '\0';
      local_b0.Name[0x20] = '\0';
      local_b0.Name[0x21] = '\0';
      local_b0.Name[0x22] = '\0';
      local_b0.Name[0x23] = '\0';
      local_b0.Name[0x24] = '\0';
      local_b0.Name[0x25] = '\0';
      local_b0.Name[0x26] = '\0';
      local_b0.Name[0x27] = '\0';
      local_b0.Name[0x10] = '\0';
      local_b0.Name[0x11] = '\0';
      local_b0.Name[0x12] = '\0';
      local_b0.Name[0x13] = '\0';
      local_b0.Name[0x14] = '\0';
      local_b0.Name[0x15] = '\0';
      local_b0.Name[0x16] = '\0';
      local_b0.Name[0x17] = '\0';
      local_b0.Name[0x18] = '\0';
      local_b0.Name[0x19] = '\0';
      local_b0.Name[0x1a] = '\0';
      local_b0.Name[0x1b] = '\0';
      local_b0.Name[0x1c] = '\0';
      local_b0.Name[0x1d] = '\0';
      local_b0.Name[0x1e] = '\0';
      local_b0.Name[0x1f] = '\0';
      local_b0.DstFont = (ImFont *)0x0;
    }
    else {
      pIVar6 = &local_b0;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pIVar6->FontData = font_cfg_template->FontData;
        font_cfg_template = (ImFontConfig *)((long)font_cfg_template + (ulong)bVar10 * -0x10 + 8);
        pIVar6 = (ImFontConfig *)((long)pIVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      }
      if (local_b0.FontData != (void *)0x0) {
        __assert_fail("font_cfg.FontData == __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                      ,0x63b,
                      "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                     );
      }
    }
    local_b0.FontDataOwnedByAtlas = true;
    pIVar2 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_b0,glyph_ranges);
    return pIVar2;
  }
  uVar1 = stb_decompress_length((uchar *)compressed_ttf_data);
  puVar9 = ttf_data + uVar1;
  puVar7 = (ushort *)((long)compressed_ttf_data + 0x10);
  stb__barrier_in_b = (uchar *)compressed_ttf_data;
  stb__barrier_out_e = puVar9;
  stb__barrier_out_b = ttf_data;
  stb__dout = ttf_data;
  do {
    bVar5 = (byte)*puVar7;
    uVar1 = (uint)bVar5;
    if (bVar5 < 0x20) {
      if (bVar5 < 0x18) {
        if (bVar5 < 0x10) {
          if (bVar5 < 8) {
            if (bVar5 != 4) {
              if (uVar1 == 6) {
                uVar4 = ~((ulong)*(byte *)((long)puVar7 + 3) |
                          (ulong)*(byte *)((long)puVar7 + 1) << 0x10 | (ulong)(byte)puVar7[1] << 8);
                uVar1 = (uint)(byte)puVar7[2];
                goto LAB_00174ddf;
              }
              if (uVar1 == 7) {
                stb__lit((byte *)((long)puVar7 + 3),
                         (ushort)(*(ushort *)((long)puVar7 + 1) << 8 |
                                 *(ushort *)((long)puVar7 + 1) >> 8) + 1);
                uVar4 = (ulong)(ushort)(*(ushort *)((long)puVar7 + 1) << 8 |
                                       *(ushort *)((long)puVar7 + 1) >> 8);
                lVar3 = 4;
                goto LAB_00174e95;
              }
              goto LAB_00174f28;
            }
            stb__match(stb__dout +
                       ~((ulong)*(byte *)((long)puVar7 + 3) |
                         (ulong)*(byte *)((long)puVar7 + 1) << 0x10 | (ulong)(byte)puVar7[1] << 8),
                       (ushort)(puVar7[2] << 8 | puVar7[2] >> 8) + 1);
            puVar8 = puVar7 + 3;
          }
          else {
            stb__lit((uchar *)(puVar7 + 1),
                     ((uint)bVar5 * 0x100 + (uint)*(byte *)((long)puVar7 + 1)) - 0x7ff);
            uVar4 = (ulong)(ushort)(*puVar7 << 8 | *puVar7 >> 8);
            lVar3 = -0x7fd;
LAB_00174e95:
            puVar8 = (ushort *)((long)puVar7 + uVar4 + lVar3);
            if (puVar8 == puVar7) {
              bVar5 = (byte)*puVar7;
LAB_00174f28:
              if ((bVar5 != 5) || (*(byte *)((long)puVar7 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                              ,0xb47,
                              "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                             );
              }
              if (stb__dout != puVar9) {
                __assert_fail("stb__dout == output + olen",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                              ,0xb41,
                              "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                             );
              }
              goto LAB_00174f54;
            }
          }
        }
        else {
          uVar4 = -(ulong)(((uint)*(byte *)((long)puVar7 + 1) * 0x100 +
                           ((uint)(byte)puVar7[1] | (uint)bVar5 << 0x10)) - 0xfffff);
          uVar1 = (uint)(ushort)(*(ushort *)((long)puVar7 + 3) << 8 |
                                *(ushort *)((long)puVar7 + 3) >> 8);
LAB_00174ddf:
          stb__match(stb__dout + uVar4,uVar1 + 1);
          puVar8 = (ushort *)((long)puVar7 + 5);
        }
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar7 + 1) * 0x100 +
                            ((uint)(byte)puVar7[1] | (uint)bVar5 << 0x10)) - 0x17ffff),
                   *(byte *)((long)puVar7 + 3) + 1);
        puVar8 = puVar7 + 2;
      }
    }
    else if ((char)bVar5 < '\0') {
      stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar7 + 1),uVar1 - 0x7f);
      puVar8 = puVar7 + 1;
    }
    else {
      if (bVar5 < 0x40) {
        stb__lit((byte *)((long)puVar7 + 1),uVar1 - 0x1f);
        uVar4 = (ulong)(byte)*puVar7;
        lVar3 = -0x1e;
        goto LAB_00174e95;
      }
      stb__match(stb__dout +
                 -(ulong)(((uint)*(byte *)((long)puVar7 + 1) + (uint)bVar5 * 0x100) - 0x3fff),
                 (byte)puVar7[1] + 1);
      puVar8 = (ushort *)((long)puVar7 + 3);
    }
    puVar7 = puVar8;
    if (puVar9 < stb__dout) {
      __assert_fail("stb__dout <= output + olen",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0xb4b,
                    "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                   );
    }
  } while( true );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)ImGui::MemAlloc(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}